

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  void **ppvVar1;
  
  ppvVar1 = loop->handle_queue;
  while (ppvVar1 = (void **)*ppvVar1, ppvVar1 != loop->handle_queue) {
    if ((*(byte *)((long)ppvVar1 + 0x11) & 0x80) == 0) {
      (*walk_cb)((uv_handle_t *)(ppvVar1 + -4),arg);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  QUEUE* q;
  uv_handle_t* h;

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);
    if (h->flags & UV__HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}